

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O3

void __thiscall
glcts::SampleShadingRenderFormatTests::~SampleShadingRenderFormatTests
          (SampleShadingRenderFormatTests *this)

{
  ~SampleShadingRenderFormatTests(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

SampleShadingRenderFormatTests::~SampleShadingRenderFormatTests(void)
{
}